

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

uint64_t __thiscall
RandomMixin<FastRandomContext>::randbits<16>(RandomMixin<FastRandomContext> *this)

{
  long lVar1;
  ulong uVar2;
  uint64_t uVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->bitbuf_size < 0x10) {
    uVar3 = FastRandomContext::rand64((FastRandomContext *)this);
    bVar4 = (byte)this->bitbuf_size;
    uVar6 = uVar3 << (bVar4 & 0x3f) | this->bitbuf;
    uVar2 = uVar3 >> (0x10 - bVar4 & 0x3f);
    iVar5 = this->bitbuf_size + 0x30;
  }
  else {
    uVar6 = this->bitbuf;
    uVar2 = uVar6 >> 0x10;
    iVar5 = this->bitbuf_size + -0x10;
  }
  this->bitbuf = uVar2;
  this->bitbuf_size = iVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar6 & 0xffff;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t randbits() noexcept
    {
        static_assert(Bits >= 0 && Bits <= 64);
        if constexpr (Bits == 64) {
            return Impl().rand64();
        } else {
            uint64_t ret;
            if (Bits <= bitbuf_size) {
                ret = bitbuf;
                bitbuf >>= Bits;
                bitbuf_size -= Bits;
            } else {
                uint64_t gen = Impl().rand64();
                ret = (gen << bitbuf_size) | bitbuf;
                bitbuf = gen >> (Bits - bitbuf_size);
                bitbuf_size = 64 + bitbuf_size - Bits;
            }
            constexpr uint64_t MASK = (uint64_t{1} << Bits) - 1;
            return ret & MASK;
        }
    }